

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

unique_ptr<TRM::Device,_std::default_delete<TRM::Device>_> __thiscall
TRM::Device::CreateBitmapDevice(Device *this,shared_ptr<TRM::Bitmap> *bitmap)

{
  BitmapDevice *this_00;
  shared_ptr<TRM::Bitmap> local_28;
  
  this_00 = (BitmapDevice *)operator_new(0x70);
  local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  BitmapDevice::BitmapDevice(this_00,&local_28);
  if (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this->_vptr_Device = (_func_int **)this_00;
  return (__uniq_ptr_data<TRM::Device,_std::default_delete<TRM::Device>,_true,_true>)
         (__uniq_ptr_data<TRM::Device,_std::default_delete<TRM::Device>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Device> Device::CreateBitmapDevice(
    std::shared_ptr<Bitmap> bitmap) {
  return std::make_unique<BitmapDevice>(bitmap);
}